

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::resetVideoMode(WindowImplX11 *this)

{
  bool bVar1;
  ostream *poVar2;
  long in_RDI;
  RROutput output;
  XRRCrtcInfo *crtcInfo;
  XRRScreenResources *res;
  int xRandRMinor;
  int xRandRMajor;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  WindowImplX11 *in_stack_ffffffffffffffc8;
  long local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  
  if ((anonymous_namespace)::WindowsImplX11Impl::fullscreenWindow != in_RDI) {
    return;
  }
  bVar1 = checkXRandR(in_stack_ffffffffffffffc8,
                      (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_18 = XRRGetScreenResources
                         (*(undefined8 *)(in_RDI + 0x3d0),
                          *(undefined8 *)
                           (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) +
                            (long)*(int *)(*(long *)(in_RDI + 0x3d0) + 0xe0) * 0x80 + 0x10));
    if (local_18 == 0) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,
                               "Failed to get the current screen resources to reset the video mode")
      ;
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    local_20 = XRRGetCrtcInfo(*(undefined8 *)(in_RDI + 0x3d0),local_18,
                              *(undefined8 *)(in_RDI + 0x400));
    if (local_20 == 0) {
      XRRFreeScreenResources(local_18);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to get crtc info to reset the video mode");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    if (((local_c == 1) && (2 < local_10)) || (1 < local_c)) {
      local_28 = XRRGetOutputPrimary(*(undefined8 *)(in_RDI + 0x3d0),
                                     *(undefined8 *)
                                      (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) +
                                       (long)*(int *)(*(long *)(in_RDI + 0x3d0) + 0xe0) * 0x80 +
                                      0x10));
      if (local_28 == 0) {
        local_28 = **(long **)(local_18 + 0x28);
      }
    }
    else {
      local_28 = **(long **)(local_18 + 0x28);
    }
    XRRSetCrtcConfig(*(undefined8 *)(in_RDI + 0x3d0),local_18,*(undefined8 *)(in_RDI + 0x400),0,
                     *(undefined4 *)(local_20 + 8),*(undefined4 *)(local_20 + 0xc),
                     *(undefined8 *)(in_RDI + 0x3f8),*(undefined2 *)(local_20 + 0x20),&local_28,1);
    XRRFreeCrtcInfo(local_20);
    XRRFreeScreenResources(local_18);
  }
  (anonymous_namespace)::WindowsImplX11Impl::fullscreenWindow = 0;
  return;
}

Assistant:

void WindowImplX11::resetVideoMode()
{
    using namespace WindowsImplX11Impl;

    if (fullscreenWindow == this)
    {
        // Try to set old configuration
        // Check if the XRandR extension
        int xRandRMajor, xRandRMinor;
        if (checkXRandR(xRandRMajor, xRandRMinor))
        {
            XRRScreenResources* res = XRRGetScreenResources(m_display, DefaultRootWindow(m_display));
            if (!res)
            {
                err() << "Failed to get the current screen resources to reset the video mode" << std::endl;
                return;
            }

            // Retreive current screen position and rotation
            XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, m_oldRRCrtc);
            if (!crtcInfo)
            {
                XRRFreeScreenResources(res);
                err() << "Failed to get crtc info to reset the video mode" << std::endl;
                return;
            }

            RROutput output;

            // if version >= 1.3 get the primary screen else take the first screen
            if ((xRandRMajor == 1 && xRandRMinor >= 3) || xRandRMajor > 1)
            {
                output = XRRGetOutputPrimary(m_display, DefaultRootWindow(m_display));

                // Check if returned output is valid, otherwise use the first screen
                if (output == None)
                    output = res->outputs[0];
            }
            else{
                output = res->outputs[0];
            }

            XRRSetCrtcConfig(m_display,
                             res,
                             m_oldRRCrtc,
                             CurrentTime,
                             crtcInfo->x,
                             crtcInfo->y,
                             m_oldVideoMode,
                             crtcInfo->rotation,
                             &output,
                             1);

            XRRFreeCrtcInfo(crtcInfo);
            XRRFreeScreenResources(res);
        }

        // Reset the fullscreen window
        fullscreenWindow = NULL;
    }
}